

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

JavascriptString *
Js::JavascriptArray::JoinHelper
          (Var thisArg,JavascriptString *separator,ScriptContext *scriptContext)

{
  Type TVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptArray *arr;
  JavascriptProxy *this;
  RecyclableObject *object;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  JavascriptNativeFloatArray *arr_00;
  JavascriptString *pJVar4;
  JavascriptNumberObject *object_00;
  JavascriptNativeIntArray *arr_01;
  FinallyObject local_98;
  Var *local_88;
  bool *local_80;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  Var thisArg_local;
  Var target;
  ScriptContext *local_40;
  ScriptContext *scriptContext_local;
  bool isProxy;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  jsReentLock._24_8_ = thisArg;
  target = separator;
  local_40 = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,thisArg);
  bVar2 = IsNonES5Array(thisArg);
  if (bVar2) {
    arr = UnsafeVarTo<Js::JavascriptArray>(thisArg);
  }
  else {
    arr = (JavascriptArray *)0x0;
  }
  bVar2 = VarIs<Js::JavascriptProxy>(thisArg);
  if (bVar2) {
    this = UnsafeVarTo<Js::JavascriptProxy>(thisArg);
  }
  else {
    this = (JavascriptProxy *)0x0;
  }
  if (arr == (JavascriptArray *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = (((((arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
              javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr ==
            scriptContext;
  }
  if (this == (JavascriptProxy *)0x0) {
    scriptContext_local._7_1_ = false;
LAB_00b75545:
    thisArg_local = (Var)0x0;
    BVar3 = ScriptContext::CheckObject(scriptContext,thisArg);
    if (BVar3 != 0) {
LAB_00b75554:
      pJVar4 = JavascriptLibrary::GetEmptyString
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      goto LAB_00b756d6;
    }
LAB_00b75563:
    ScriptContext::PushObject(scriptContext,thisArg);
  }
  else {
    scriptContext_local._7_1_ =
         (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr == scriptContext;
    thisArg_local = (Var)0x0;
    if (!(bool)scriptContext_local._7_1_) goto LAB_00b75545;
    object = JavascriptProxy::GetTarget(this);
    thisArg_local = object;
    if (object == (RecyclableObject *)0x0) goto LAB_00b75563;
    BVar3 = ScriptContext::CheckObject(scriptContext,object);
    if (BVar3 != 0) goto LAB_00b75554;
    ScriptContext::PushObject(scriptContext,object);
  }
  local_98.finallyFunc = (anon_class_48_6_9e8417c9 *)&local_40;
  local_98._8_8_ = (long)&scriptContext_local + 7;
  local_88 = &thisArg_local;
  local_80 = &jsReentLock.m_savedNoJsReentrancy;
  if (bVar2) {
    if (((thisArg != (Var)0x0) &&
        (bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(thisArg), bVar2)) &&
       (this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(thisArg),
       this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
    }
    TVar1 = ((arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->typeId;
    if (TVar1 == TypeIds_Array) {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pJVar4 = JoinArrayHelper<Js::JavascriptArray>(arr,(JavascriptString *)target,local_40);
      goto LAB_00b75690;
    }
    if (TVar1 == TypeIds_NativeIntArray) {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      arr_01 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>(arr);
      pJVar4 = JoinArrayHelper<Js::JavascriptNativeIntArray>
                         (arr_01,(JavascriptString *)target,local_40);
      goto LAB_00b75690;
    }
    if (TVar1 == TypeIds_ArrayLast) {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      arr_00 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(arr);
      pJVar4 = JoinArrayHelper<Js::JavascriptNativeFloatArray>
                         (arr_00,(JavascriptString *)target,local_40);
      goto LAB_00b75690;
    }
    anon_func::FinallyObject::~FinallyObject(&local_98);
  }
  else {
    bVar2 = VarIs<Js::RecyclableObject>(thisArg);
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if (bVar2) {
      object_00 = (JavascriptNumberObject *)VarTo<Js::RecyclableObject>((Var)jsReentLock._24_8_);
    }
    else {
      object_00 = JavascriptLibrary::CreateNumberObject
                            ((local_40->super_ScriptContextBase).javascriptLibrary,
                             (Var)jsReentLock._24_8_);
    }
    pJVar4 = JoinOtherHelper((RecyclableObject *)object_00,(JavascriptString *)target,local_40);
LAB_00b75690:
    JsReentLock::MutateArrayObject((JsReentLock *)local_78);
    *(bool *)((long)local_78 + 0x108) = true;
    anon_func::FinallyObject::~FinallyObject(&local_98);
    if (pJVar4 != (JavascriptString *)0x0) goto LAB_00b756d6;
  }
  pJVar4 = JavascriptLibrary::GetEmptyString((local_40->super_ScriptContextBase).javascriptLibrary);
LAB_00b756d6:
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pJVar4;
}

Assistant:

JavascriptString* JavascriptArray::JoinHelper(Var thisArg, JavascriptString* separator, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, thisArg);

        JavascriptArray * arr = JavascriptArray::TryVarToNonES5Array(thisArg);
        JavascriptProxy * proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(thisArg);
        bool isArray = arr && (scriptContext == arr->GetScriptContext());
        bool isProxy = proxy && (scriptContext == proxy->GetScriptContext());
        Var target = NULL;
        bool isTargetObjectPushed = false;
        // if we are visiting a proxy object, track that we have visited the target object as well so the next time w
        // call the join helper for the target of this proxy, we will return above.
        if (isProxy)
        {
            Assert(proxy);
            target = proxy->GetTarget();
            if (target != nullptr)
            {
                // If we end up joining same array, instead of going in infinite loop, return the empty string
                if (scriptContext->CheckObject(target))
                {
                    return scriptContext->GetLibrary()->GetEmptyString();
                }
                else
                {
                    scriptContext->PushObject(target);
                    isTargetObjectPushed = true;
                }
            }
        }
        // If we end up joining same array, instead of going in infinite loop, return the empty string
        else if (scriptContext->CheckObject(thisArg))
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        if (!isTargetObjectPushed)
        {
            scriptContext->PushObject(thisArg);
        }

        JavascriptString* res = nullptr;

        TryFinally([&]()
        {
            if (isArray)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray(thisArg);
#endif
                switch (arr->GetTypeId())
                {
                case Js::TypeIds_Array:
                    JS_REENTRANT(jsReentLock, res = JoinArrayHelper(arr, separator, scriptContext));
                    break;
                case Js::TypeIds_NativeIntArray:
                    JS_REENTRANT(jsReentLock, res = JoinArrayHelper(UnsafeVarTo<JavascriptNativeIntArray>(arr), separator, scriptContext));
                    break;
                case Js::TypeIds_NativeFloatArray:
                    JS_REENTRANT(jsReentLock, res = JoinArrayHelper(UnsafeVarTo<JavascriptNativeFloatArray>(arr), separator, scriptContext));
                    break;
                }

            }
            else if (VarIs<RecyclableObject>(thisArg))
            {
                JS_REENTRANT(jsReentLock, res = JoinOtherHelper(VarTo<RecyclableObject>(thisArg), separator, scriptContext));
            }
            else
            {
                JS_REENTRANT(jsReentLock, res = JoinOtherHelper(scriptContext->GetLibrary()->CreateNumberObject(thisArg), separator, scriptContext));
            }
        },
        [&](bool/*hasException*/)
        {
            Var top = scriptContext->PopObject();
            if (isProxy)
            {
                AssertMsg(top == target, "Unmatched operation stack");
            }
            else
            {
                AssertMsg(top == thisArg, "Unmatched operation stack");
            }
        });

        if (res == nullptr)
        {
            res = scriptContext->GetLibrary()->GetEmptyString();
        }

        return res;
    }